

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_blancer.hpp
# Opt level: O0

int __thiscall
coro_io::load_blancer<cinatra::coro_http_client,_coro_io::io_context_pool>::WRRLoadBlancer::
get_max_weight_gcd(WRRLoadBlancer *this)

{
  reference pvVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *in_RDI;
  size_t i;
  int cur_min;
  int cur_max;
  int res;
  ulong uVar3;
  ulong __n;
  common_type_t<int,_int> local_c [3];
  
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,0);
  local_c[0] = *pvVar1;
  uVar3 = 0;
  while( true ) {
    __n = uVar3;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RDI);
    if (sVar2 <= uVar3) break;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,__n);
    std::max<int>(local_c,pvVar1);
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](in_RDI,__n);
    std::min<int>(local_c,pvVar1);
    local_c[0] = std::gcd<int,int>((int)(__n >> 0x20),(int)__n);
    uVar3 = __n + 1;
  }
  return local_c[0];
}

Assistant:

int get_max_weight_gcd() {
      int res = weights_[0];
      int cur_max = 0, cur_min = 0;
      for (size_t i = 0; i < weights_.size(); i++) {
        cur_max = (std::max)(res, weights_[i]);
        cur_min = (std::min)(res, weights_[i]);
        res = std::gcd(cur_max, cur_min);
      }
      return res;
    }